

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O3

int64_t embree::get_xcr0(void)

{
  int in_XCR0;
  
  return (long)in_XCR0;
}

Assistant:

__noinline int64_t get_xcr0() 
  {
#if defined (__WIN32__) && !defined (__MINGW32__) && defined(_XCR_XFEATURE_ENABLED_MASK)
    int64_t xcr0 = 0; // int64_t is workaround for compiler bug under VS2013, Win32
    xcr0 = _xgetbv(0);
    return xcr0;
#else
    int xcr0 = 0;
    __asm__ ("xgetbv" : "=a" (xcr0) : "c" (0) : "%edx" );
    return xcr0;
#endif
  }